

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

ssize_t data_source_read_callback
                  (nghttp2_session *session,int32_t stream_id,uint8_t *buf,size_t length,
                  uint32_t *data_flags,nghttp2_data_source *source,void *userp)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  
  if (stream_id == 0) {
    return -0x1f5;
  }
  pvVar2 = nghttp2_session_get_stream_user_data(session,stream_id);
  sVar4 = 0xfffffffffffffc7a;
  if ((pvVar2 != (void *)0x0) && (lVar1 = *(long *)((long)pvVar2 + 0x198), lVar1 != 0)) {
    if (*(ulong *)(lVar1 + 0x2d8) < length) {
      length = *(ulong *)(lVar1 + 0x2d8);
    }
    sVar4 = length;
    if (length == 0) {
      lVar3 = *(long *)(lVar1 + 0x2e0);
      sVar4 = 0xfffffffffffffe04;
    }
    else {
      memcpy(buf,*(void **)(lVar1 + 0x2d0),length);
      *(long *)(lVar1 + 0x2d0) = *(long *)(lVar1 + 0x2d0) + length;
      *(long *)(lVar1 + 0x2d8) = *(long *)(lVar1 + 0x2d8) - length;
      lVar3 = *(long *)(lVar1 + 0x2e0);
      if (*(long *)((long)pvVar2 + 0x1168) != -1) {
        lVar3 = lVar3 - length;
        *(long *)(lVar1 + 0x2e0) = lVar3;
      }
    }
    if (lVar3 == 0) {
      *data_flags = 1;
      sVar4 = length;
    }
  }
  return sVar4;
}

Assistant:

static ssize_t data_source_read_callback(nghttp2_session *session,
                                         int32_t stream_id,
                                         uint8_t *buf, size_t length,
                                         uint32_t *data_flags,
                                         nghttp2_data_source *source,
                                         void *userp)
{
  struct Curl_easy *data_s;
  struct HTTP *stream = NULL;
  size_t nread;
  (void)source;
  (void)userp;

  if(stream_id) {
    /* get the stream from the hash based on Stream ID, stream ID zero is for
       connection-oriented stuff */
    data_s = nghttp2_session_get_stream_user_data(session, stream_id);
    if(!data_s)
      /* Receiving a Stream ID not in the hash should not happen, this is an
         internal error more than anything else! */
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    stream = data_s->req.p.http;
    if(!stream)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
  else
    return NGHTTP2_ERR_INVALID_ARGUMENT;

  nread = CURLMIN(stream->upload_len, length);
  if(nread > 0) {
    memcpy(buf, stream->upload_mem, nread);
    stream->upload_mem += nread;
    stream->upload_len -= nread;
    if(data_s->state.infilesize != -1)
      stream->upload_left -= nread;
  }

  if(stream->upload_left == 0)
    *data_flags = NGHTTP2_DATA_FLAG_EOF;
  else if(nread == 0)
    return NGHTTP2_ERR_DEFERRED;

  H2BUGF(infof(data_s, "data_source_read_callback: "
               "returns %zu bytes stream %u",
               nread, stream_id));

  return nread;
}